

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_expr.hpp
# Opt level: O1

bool __thiscall
viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::deep_equal
          (rt_binary_expr<viennamath::rt_expression_interface<double>_> *this,
          rt_expression_interface<double> *other)

{
  rt_expression_interface<double> *prVar1;
  op_interface<viennamath::rt_expression_interface<double>_> *poVar2;
  int iVar3;
  long lVar4;
  
  if (other != (rt_expression_interface<double> *)0x0) {
    lVar4 = __dynamic_cast(other,&rt_expression_interface<double>::typeinfo,
                           &rt_binary_expr<viennamath::rt_expression_interface<double>>::typeinfo,0)
    ;
    if (lVar4 != 0) {
      prVar1 = (this->lhs_)._M_ptr;
      iVar3 = (*prVar1->_vptr_rt_expression_interface[0xb])(prVar1,*(undefined8 *)(lVar4 + 8));
      if ((char)iVar3 != '\0') {
        poVar2 = (this->op_)._M_ptr;
        iVar3 = (*poVar2->_vptr_op_interface[0xc])(poVar2,*(undefined8 *)(lVar4 + 0x10));
        if ((char)iVar3 != '\0') {
          prVar1 = (this->rhs_)._M_ptr;
          iVar3 = (*prVar1->_vptr_rt_expression_interface[0xb])
                            (prVar1,*(undefined8 *)(lVar4 + 0x18));
          return SUB41(iVar3,0);
        }
      }
    }
  }
  return false;
}

Assistant:

bool deep_equal(const InterfaceType * other) const
      {
        if (dynamic_cast< const rt_binary_expr * >(other) != NULL)
        {
          const rt_binary_expr * temp = dynamic_cast< const rt_binary_expr * >(other);
          return lhs_->deep_equal(temp->lhs())
                 && op_->equal(temp->op())
                 && rhs_->deep_equal(temp->rhs());
        }
        return false;
        //return lhs_->deep_equal(other) && rhs_->deep_equal(other);
      }